

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

vssListType * __thiscall
Instance::getVSS(vssListType *__return_storage_ptr__,Instance *this,int ttd)

{
  bool bVar1;
  Z3_lbool ZVar2;
  int iVar3;
  ulong uVar4;
  Edge *this_00;
  int currNode;
  vssListType *local_a0;
  vssType currVss;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> ttdEdges;
  model m;
  ast local_58;
  undefined8 local_48;
  ast local_40;
  
  z3::optimize::get_model((optimize *)&m);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currVss.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currVss.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  currVss.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a0 = __return_storage_ptr__;
  Graph::getTTD(&ttdEdges,&this->graph,ttd);
  this_00 = *ttdEdges.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar1 = Graph::isBoundary(&this->graph,this_00->from);
  currNode = (&this_00->from)[!bVar1];
  std::vector<int,_std::allocator<int>_>::push_back(&currVss,&currNode);
  for (uVar4 = 1;
      uVar4 < (ulong)((long)ttdEdges.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)ttdEdges.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    currNode = Edge::getOtherVertex(this_00,currNode);
    z3::ast_vector_tpl<z3::expr>::operator[]
              ((ast_vector_tpl<z3::expr> *)&local_40,(int)this + 0x170);
    z3::model::eval((model *)&local_58,(expr *)&m,SUB81(&local_40,0));
    ZVar2 = z3::expr::bool_value((expr *)&local_58);
    z3::ast::~ast(&local_58);
    z3::ast::~ast(&local_40);
    if (ZVar2 == Z3_L_TRUE) {
      std::vector<int,_std::allocator<int>_>::push_back(&currVss,&currNode);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_a0,&currVss);
      local_48 = 0;
      local_58.super_object.m_ctx = (context *)0x0;
      local_58.m_ast = (Z3_ast)0x0;
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&currVss,&local_58);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
    }
    std::vector<int,_std::allocator<int>_>::push_back(&currVss,&currNode);
    this_00 = ttdEdges.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
  }
  iVar3 = Edge::getOtherVertex(this_00,currNode);
  local_58.super_object.m_ctx._0_4_ = iVar3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&currVss,(int *)&local_58);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back(local_a0,&currVss);
  std::_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>::~_Vector_base
            (&ttdEdges.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&currVss.super__Vector_base<int,_std::allocator<int>_>);
  z3::model::~model(&m);
  return local_a0;
}

Assistant:

vssListType Instance::getVSS(int ttd) {
  model m = solver.get_model();
  vssListType vss;
  vssType currVss;
  std::vector<const Edge *> ttdEdges = graph.getTTD(ttd);
  const Edge *currEdge = ttdEdges[0];
  int currNode =
      graph.isBoundary(currEdge->from) ? currEdge->from : currEdge->to;
  currVss.push_back(currNode);
  for (size_t i = 1; i < ttdEdges.size(); i++) {
    if (m.eval(borderVars[(currNode = currEdge->getOtherVertex(currNode))],
               false)
            .bool_value() == Z3_TRUE) {
      currVss.push_back(currNode);
      vss.push_back(currVss);
      currVss = vssType();
    }
    currVss.push_back(currNode);
    currEdge = ttdEdges[i];
  }
  currVss.push_back(currEdge->getOtherVertex(currNode));
  vss.push_back(currVss);
  return vss;
}